

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O2

uint mjs::unicode::utf32_to_utf16<wchar_t>(char32_t code_point,wchar_t *out)

{
  uint uVar1;
  
  uVar1 = utf16_code_unit_count(code_point);
  if (uVar1 != 0) {
    if (uVar1 == 2) {
      *out = (uint)(code_point + L'\x000f0000') >> 10 & 0x3ff | 0xd800;
      out[1] = code_point & 0x3ffU | 0xdc00;
    }
    else {
      if (uVar1 != 1) {
        __assert_fail("l == invalid_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                      ,0x9a,
                      "unsigned int mjs::unicode::utf32_to_utf16(char32_t, CharT *) [CharT = wchar_t]"
                     );
      }
      *out = code_point & 0xffff;
    }
  }
  return uVar1;
}

Assistant:

constexpr unsigned utf32_to_utf16(char32_t code_point, CharT* out) {
    static_assert(sizeof(CharT) >= sizeof(char16_t));
    const auto l = utf16_code_unit_count(code_point);
    if (l == 1) {
        out[0] = static_cast<CharT>(static_cast<char16_t>(code_point));
    } else if (l == 2) {
        code_point -= 0x10000;
        out[0] = static_cast<CharT>(static_cast<char16_t>(utf16_high_surrogate | ((code_point >> 10) & 0x3ff)));
        out[1] = static_cast<CharT>(static_cast<char16_t>(utf16_low_surrogate | (code_point & 0x3ff)));
    } else {
        assert(l == invalid_length);
    }
    return l;
}